

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::growTree(BTreeImpl *this,uint minCapacity)

{
  NodeUnion *newTree;
  Fault local_40;
  Fault f;
  NodeUnion *local_30;
  void *allocPtr;
  uint local_20;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int>_> local_1c;
  WiderType<Decay<unsigned_int>,_Decay<int>_> local_18;
  uint local_14;
  uint newCapacity;
  uint minCapacity_local;
  BTreeImpl *this_local;
  
  local_20 = this->treeCapacity << 1;
  local_14 = minCapacity;
  _newCapacity = this;
  local_1c = max<unsigned_int&,unsigned_int>(&local_14,&local_20);
  allocPtr._4_4_ = 4;
  local_18 = max<unsigned_int,int>(&local_1c,(char (*) [7])((long)&allocPtr + 4));
  this->freelistSize = (local_18 - this->treeCapacity) + this->freelistSize;
  f.exception._4_4_ = posix_memalign(&local_30,0x40,(ulong)local_18 << 6);
  if (f.exception._4_4_ != 0) {
    Debug::Fault::Fault(&local_40,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                        ,0x116,f.exception._4_4_,"posix_memalign","");
    Debug::Fault::fatal(&local_40);
  }
  acopy<kj::_::BTreeImpl::NodeUnion>(local_30,this->tree,(ulong)this->treeCapacity);
  azero<kj::_::BTreeImpl::NodeUnion>
            (local_30 + this->treeCapacity,(ulong)(local_18 - this->treeCapacity));
  if (this->tree != (NodeUnion *)EMPTY_NODE) {
    ::free(this->tree);
  }
  this->tree = local_30;
  this->treeCapacity = local_18;
  return;
}

Assistant:

void BTreeImpl::growTree(uint minCapacity) {
  uint newCapacity = kj::max(kj::max(minCapacity, treeCapacity * 2), 4);
  freelistSize += newCapacity - treeCapacity;

  // Allocate some aligned memory! In theory this should be as simple as calling the C11 standard
  // aligned_alloc() function. Unfortunately, many platforms don't implement it. Luckily, there
  // are usually alternatives.

#if _WIN32
  // Windows lacks aligned_alloc() but has its own _aligned_malloc() (which requires freeing using
  // _aligned_free()).
  // WATCH OUT: The argument order for _aligned_malloc() is opposite of aligned_alloc()!
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
      _aligned_malloc(newCapacity * sizeof(BTreeImpl::NodeUnion), sizeof(BTreeImpl::NodeUnion)));
  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);
#else
  // macOS, OpenBSD, and Android lack aligned_alloc(), but have posix_memalign(). Fine.
  void* allocPtr;
  int error = posix_memalign(&allocPtr,
      sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion));
  if (error != 0) {
    KJ_FAIL_SYSCALL("posix_memalign", error);
  }
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(allocPtr);
#endif

  // Note: C11 introduces aligned_alloc() as a standard, but it's still missing on many platforms,
  //   so we don't use it. But if you wanted to use it, you'd do this:
//  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
//      aligned_alloc(sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion)));
//  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);

  acopy(newTree, tree, treeCapacity);
  azero(newTree + treeCapacity, newCapacity - treeCapacity);
  if (tree != &EMPTY_NODE) aligned_free(tree);
  tree = newTree;
  treeCapacity = newCapacity;
}